

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

ogt_vox_transform *
ogt_vox_sample_instance_transform_global
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_instance *instance,uint32_t frame_index
          ,ogt_vox_scene *scene)

{
  ogt_vox_transform local_b0;
  ogt_vox_group *local_70;
  ogt_vox_group *group;
  undefined1 local_60 [4];
  uint32_t group_index;
  ogt_vox_transform final_transform;
  ogt_vox_scene *scene_local;
  uint32_t frame_index_local;
  ogt_vox_instance *instance_local;
  
  final_transform._56_8_ = scene;
  ogt_vox_sample_instance_transform_local((ogt_vox_transform *)local_60,instance,frame_index);
  group._4_4_ = instance->group_index;
  if (group._4_4_ == 0xffffffff) {
    memcpy(__return_storage_ptr__,local_60,0x40);
  }
  else {
    local_70 = (ogt_vox_group *)
               (*(long *)(final_transform._56_8_ + 0x28) + (ulong)group._4_4_ * 0x68);
    ogt_vox_sample_group_transform_global
              (&local_b0,local_70,frame_index,(ogt_vox_scene *)final_transform._56_8_);
    ogt_vox_transform_multiply(__return_storage_ptr__,(ogt_vox_transform *)local_60,&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

ogt_vox_transform ogt_vox_sample_instance_transform_global(const ogt_vox_instance* instance, uint32_t frame_index, const ogt_vox_scene* scene)
    {
        ogt_vox_transform final_transform = ogt_vox_sample_instance_transform_local(instance, frame_index);
        uint32_t group_index = instance->group_index;
        if (group_index == k_invalid_group_index)
            return final_transform;
        const ogt_vox_group* group = &scene->groups[group_index];
        return ogt_vox_transform_multiply(final_transform, ogt_vox_sample_group_transform_global(group, frame_index, scene));
    }